

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O2

double * inform_local_block_entropy
                   (int *series,size_t n,size_t m,int b,size_t k,double *be,inform_error *err)

{
  int *piVar1;
  _Bool _Var2;
  size_t j;
  double *__ptr;
  void *__ptr_00;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  int q;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t i;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double *local_58;
  
  _Var2 = check_arguments(series,n,m,b,k,err);
  if (_Var2) {
    return (double *)0x0;
  }
  lVar6 = ((m - k) + 1) * n;
  local_58 = be;
  if ((be != (double *)0x0) || (local_58 = (double *)malloc(lVar6 * 8), local_58 != (double *)0x0))
  {
    auVar15._8_4_ = (int)(k >> 0x20);
    auVar15._0_8_ = k;
    auVar15._12_4_ = 0x45300000;
    dVar13 = pow((double)b,
                 (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    __ptr = (double *)
            calloc((long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13,4);
    if (__ptr == (double *)0x0) {
      __ptr = local_58;
      if (be != (double *)0x0) goto LAB_001330ee;
    }
    else {
      __ptr_00 = malloc(lVar6 * 4);
      if (__ptr_00 != (void *)0x0) {
        piVar5 = series + -k;
        lVar7 = (long)__ptr_00 + k * -4 + 4;
        sVar8 = 0;
LAB_00132fe0:
        if (sVar8 == n) {
          auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar14._0_8_ = lVar6;
          auVar14._12_4_ = 0x45300000;
          for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
            dVar13 = log2((double)*(uint *)((long)__ptr +
                                           (long)*(int *)((long)__ptr_00 + lVar7 * 4) * 4) /
                          ((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)));
            local_58[lVar7] = -dVar13;
          }
          free(__ptr_00);
          free(__ptr);
          return local_58;
        }
        iVar10 = 0;
        iVar9 = 1;
        for (uVar3 = 0; uVar4 = k - 1, k - 1 != uVar3; uVar3 = uVar3 + 1) {
          iVar9 = iVar9 * b;
          iVar10 = iVar10 * b + series[uVar3];
        }
        do {
          do {
            if (m <= uVar4) {
              sVar8 = sVar8 + 1;
              series = series + m;
              piVar5 = piVar5 + m;
              lVar7 = lVar7 + m * 4 + k * -4 + 4;
              goto LAB_00132fe0;
            }
            lVar12 = (long)series[uVar4] + (long)(iVar10 * b);
            piVar1 = (int *)((long)__ptr + lVar12 * 4);
            *piVar1 = *piVar1 + 1;
            iVar11 = (int)lVar12;
            *(int *)(lVar7 + uVar4 * 4) = iVar11;
            uVar4 = uVar4 + 1;
          } while (m == uVar4);
          iVar10 = iVar11 - piVar5[uVar4] * iVar9;
        } while( true );
      }
      if (be == (double *)0x0) {
        free(local_58);
      }
    }
    free(__ptr);
  }
LAB_001330ee:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, double *be, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k + 1);

    bool allocate_be = (be == NULL);
    if (allocate_be)
    {
        be = malloc(N * sizeof(double));
        if (be == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        if (allocate_be) free(be);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states = { data, states_size, N };

    int *state = malloc(N * sizeof(int));
    if (state == NULL)
    {
        if (allocate_be) free(be);
        free(data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    accumulate_local_observations(series, n, m, b, k, &states, state);

    double s;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        be[i] = -log2(s/N);
    }

    free(state);
    free(data);

    return be;
}